

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadFieldSets(CrateReader *this)

{
  value_type vVar1;
  long lVar2;
  StreamReader *this_00;
  undefined1 numInts [8];
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  size_t __new_size;
  size_t __new_size_00;
  void *pvVar6;
  void *pvVar7;
  char *pcVar8;
  void *pvVar9;
  uint *ints;
  char *workingSpace;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  unsigned_long *in_R8;
  size_type local_1078;
  size_t i;
  string err;
  ostringstream local_1030 [8];
  ostringstream ss_e_8;
  string local_eb8;
  ostringstream local_e98 [8];
  ostringstream ss_e_7;
  string local_d20;
  ostringstream local_d00 [8];
  ostringstream ss_e_6;
  void *local_b88;
  uint64_t fsets_size;
  vector<char,_std::allocator<char>_> working_space;
  ostringstream local_b48 [8];
  ostringstream ss_e_5;
  size_t workBufferSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  string local_9a8;
  ostringstream local_988 [8];
  ostringstream ss_e_4;
  undefined1 local_810 [8];
  vector<char,_std::allocator<char>_> comp_buffer;
  ostringstream local_7d8 [8];
  ostringstream ss_e_3;
  size_t compBufferSize;
  ostringstream local_638 [8];
  ostringstream ss_e_2;
  string local_4c0;
  allocator local_499;
  string local_498 [32];
  string local_478;
  ostringstream local_458 [8];
  ostringstream ss_e_1;
  string local_2e0;
  ostringstream local_2c0 [8];
  ostringstream ss_e;
  undefined1 local_148 [8];
  uint64_t num_fieldsets;
  Section *s;
  string local_118;
  string local_f8;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  CrateReader *local_18;
  CrateReader *this_local;
  
  local_18 = this;
  if (-1 < this->_fieldsets_index) {
    lVar2 = this->_fieldsets_index;
    sVar4 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::size
                      (&(this->_toc).sections);
    if (lVar2 < (long)sVar4) {
      if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
        ::std::__cxx11::to_string(&local_f8,(uint)this->_version[0]);
        ::std::operator+((char *)local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Version must be 0.4.0 or later, but got ");
        ::std::operator+(local_b8,(char *)local_d8);
        ::std::__cxx11::to_string(&local_118,(uint)this->_version[1]);
        ::std::operator+(local_98,local_b8);
        ::std::operator+(local_78,(char *)local_98);
        ::std::__cxx11::to_string((string *)&s,(uint)this->_version[2]);
        ::std::operator+(local_58,local_78);
        ::std::operator+(local_38,(char *)local_58);
        ::std::__cxx11::string::operator+=((string *)&this->_err,(string *)local_38);
        ::std::__cxx11::string::~string((string *)local_38);
        ::std::__cxx11::string::~string((string *)local_58);
        ::std::__cxx11::string::~string((string *)&s);
        ::std::__cxx11::string::~string((string *)local_78);
        ::std::__cxx11::string::~string((string *)local_98);
        ::std::__cxx11::string::~string((string *)&local_118);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::__cxx11::string::~string(local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        this_local._7_1_ = 0;
      }
      else {
        num_fieldsets =
             (uint64_t)
             ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             operator[](&(this->_toc).sections,this->_fieldsets_index);
        bVar3 = StreamReader::seek_set(this->_sr,((reference)num_fieldsets)->start);
        if (bVar3) {
          bVar3 = StreamReader::read8(this->_sr,(uint64_t *)local_148);
          if (bVar3) {
            if (local_148 == (undefined1  [8])0x0) {
              ::std::__cxx11::ostringstream::ostringstream(local_2c0);
              poVar5 = ::std::operator<<((ostream *)local_2c0,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16b9);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_2c0,"`FIELDSETS` is empty.");
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_2e0);
              ::std::__cxx11::string::~string((string *)&local_2e0);
              ::std::__cxx11::ostringstream::~ostringstream(local_2c0);
              this_local._7_1_ = 0;
            }
            else if ((this->_config).maxNumFieldSets < (ulong)local_148) {
              ::std::__cxx11::ostringstream::ostringstream(local_458);
              poVar5 = ::std::operator<<((ostream *)local_458,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16be);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_498,"Too many FieldSets {}. maxNumFieldSets is set to {}",&local_499)
              ;
              fmt::format<unsigned_long,unsigned_long>
                        (&local_478,(fmt *)local_498,(string *)local_148,
                         &(this->_config).maxNumFieldSets,in_R8);
              poVar5 = ::std::operator<<((ostream *)local_458,(string *)&local_478);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_478);
              ::std::__cxx11::string::~string(local_498);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_499);
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_4c0);
              ::std::__cxx11::string::~string((string *)&local_4c0);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_458);
            }
            else {
              this->_memoryUsage = (long)local_148 * 4 + this->_memoryUsage;
              if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                ::std::__cxx11::ostringstream::ostringstream(local_638);
                poVar5 = ::std::operator<<((ostream *)local_638,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,"[Crate]");
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16c1);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)local_638,"Reached to max memory budget.");
                ::std::operator<<(poVar5,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&compBufferSize);
                ::std::__cxx11::string::~string((string *)&compBufferSize);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_638);
              }
              else {
                ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
                resize(&this->_fieldset_indices,(size_type)local_148);
                __new_size = Usd_IntegerCompression::GetCompressedBufferSize((size_t)local_148);
                this->_memoryUsage = __new_size + this->_memoryUsage;
                if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                  ::std::__cxx11::ostringstream::ostringstream(local_7d8);
                  poVar5 = ::std::operator<<((ostream *)local_7d8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,"[Crate]");
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16c9);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)local_7d8,"Reached to max memory budget.");
                  ::std::operator<<(poVar5,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)
                                 &comp_buffer.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.field_0x10);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &comp_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_7d8);
                }
                else {
                  ::std::vector<char,_std::allocator<char>_>::vector
                            ((vector<char,_std::allocator<char>_> *)local_810);
                  ::std::vector<char,_std::allocator<char>_>::resize
                            ((vector<char,_std::allocator<char>_> *)local_810,__new_size);
                  this->_memoryUsage = (long)local_148 * 4 + this->_memoryUsage;
                  if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                    ::std::__cxx11::ostringstream::ostringstream(local_988);
                    poVar5 = ::std::operator<<((ostream *)local_988,"[error]");
                    poVar5 = ::std::operator<<(poVar5,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar5 = ::std::operator<<(poVar5,"[Crate]");
                    poVar5 = ::std::operator<<(poVar5,":");
                    poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                    poVar5 = ::std::operator<<(poVar5,"():");
                    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16ce);
                    ::std::operator<<(poVar5," ");
                    poVar5 = ::std::operator<<((ostream *)local_988,"Reached to max memory budget.")
                    ;
                    ::std::operator<<(poVar5,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_9a8);
                    ::std::__cxx11::string::~string((string *)&local_9a8);
                    this_local._7_1_ = 0;
                    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_988);
                  }
                  else {
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &workBufferSize);
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &workBufferSize,(size_type)local_148);
                    __new_size_00 =
                         Usd_IntegerCompression::GetDecompressionWorkingSpaceSize((size_t)local_148)
                    ;
                    this->_memoryUsage = __new_size_00 + this->_memoryUsage;
                    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                      ::std::__cxx11::ostringstream::ostringstream(local_b48);
                      poVar5 = ::std::operator<<((ostream *)local_b48,"[error]");
                      poVar5 = ::std::operator<<(poVar5,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar5 = ::std::operator<<(poVar5,"[Crate]");
                      poVar5 = ::std::operator<<(poVar5,":");
                      poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                      poVar5 = ::std::operator<<(poVar5,"():");
                      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16d5);
                      ::std::operator<<(poVar5," ");
                      poVar5 = ::std::operator<<((ostream *)local_b48,
                                                 "Reached to max memory budget.");
                      ::std::operator<<(poVar5,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)
                                     &working_space.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
                      ::std::__cxx11::string::~string
                                ((string *)
                                 &working_space.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.field_0x10);
                      this_local._7_1_ = 0;
                      tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_b48);
                    }
                    else {
                      ::std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)&fsets_size);
                      ::std::vector<char,_std::allocator<char>_>::resize
                                ((vector<char,_std::allocator<char>_> *)&fsets_size,__new_size_00);
                      bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_b88);
                      pvVar9 = local_b88;
                      if (bVar3) {
                        pvVar6 = (void *)::std::vector<char,_std::allocator<char>_>::size
                                                   ((vector<char,_std::allocator<char>_> *)local_810
                                                   );
                        if (pvVar6 < pvVar9) {
                          local_b88 = (void *)::std::vector<char,_std::allocator<char>_>::size
                                                        ((vector<char,_std::allocator<char>_> *)
                                                         local_810);
                        }
                        pvVar9 = local_b88;
                        pvVar7 = (void *)StreamReader::size(this->_sr);
                        pvVar6 = local_b88;
                        if (pvVar7 < pvVar9) {
                          ::std::__cxx11::ostringstream::ostringstream(local_e98);
                          poVar5 = ::std::operator<<((ostream *)local_e98,"[error]");
                          poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar5 = ::std::operator<<(poVar5,"[Crate]");
                          poVar5 = ::std::operator<<(poVar5,":");
                          poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                          poVar5 = ::std::operator<<(poVar5,"():");
                          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16e7);
                          ::std::operator<<(poVar5," ");
                          poVar5 = ::std::operator<<((ostream *)local_e98,
                                                     "FieldSets compressed data exceeds USDC data.")
                          ;
                          ::std::operator<<(poVar5,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_eb8);
                          ::std::__cxx11::string::~string((string *)&local_eb8);
                          this_local._7_1_ = 0;
                          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                          ::std::__cxx11::ostringstream::~ostringstream(local_e98);
                        }
                        else {
                          this_00 = this->_sr;
                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)local_810);
                          pvVar9 = (void *)StreamReader::read(this_00,(int)pvVar6,pvVar6,
                                                              (size_t)pcVar8);
                          if (pvVar6 == pvVar9) {
                            ::std::__cxx11::string::string((string *)&i);
                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                               ((vector<char,_std::allocator<char>_> *)local_810);
                            pvVar9 = local_b88;
                            ints = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *
                                              )&workBufferSize);
                            numInts = local_148;
                            workingSpace = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      &fsets_size);
                            Usd_IntegerCompression::DecompressFromBuffer
                                      (pcVar8,(size_t)pvVar9,ints,(size_t)numInts,(string *)&i,
                                       workingSpace);
                            uVar10 = ::std::__cxx11::string::empty();
                            if ((uVar10 & 1) == 0) {
                              ::std::__cxx11::string::operator+=((string *)&this->_err,(string *)&i)
                              ;
                              this_local._7_1_ = 0;
                            }
                            else {
                              for (local_1078 = 0; (undefined1  [8])local_1078 != local_148;
                                  local_1078 = local_1078 + 1) {
                                pvVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>
                                          ::operator[]((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)&workBufferSize,local_1078);
                                vVar1 = *pvVar11;
                                pvVar12 = ::std::
                                          vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                          ::operator[](&this->_fieldset_indices,local_1078);
                                pvVar12->value = vVar1;
                              }
                              if (this->_memoryUsage < __new_size_00) {
                                this->_memoryUsage = this->_memoryUsage - __new_size_00;
                              }
                              if (this->_memoryUsage < __new_size) {
                                this->_memoryUsage = this->_memoryUsage - __new_size;
                              }
                              this_local._7_1_ = 1;
                            }
                            tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                            ::std::__cxx11::string::~string((string *)&i);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(local_1030);
                            poVar5 = ::std::operator<<((ostream *)local_1030,"[error]");
                            poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                            poVar5 = ::std::operator<<(poVar5,"[Crate]");
                            poVar5 = ::std::operator<<(poVar5,":");
                            poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                            poVar5 = ::std::operator<<(poVar5,"():");
                            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16ed);
                            ::std::operator<<(poVar5," ");
                            poVar5 = ::std::operator<<((ostream *)local_1030,
                                                                                                              
                                                  "Failed to read fieldsets data at `FIELDSETS` section."
                                                  );
                            ::std::operator<<(poVar5,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,(string *)((long)&err.field_2 + 8));
                            ::std::__cxx11::string::~string
                                      ((string *)(err.field_2._M_local_buf + 8));
                            this_local._7_1_ = 0;
                            tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                            ::std::__cxx11::ostringstream::~ostringstream(local_1030);
                          }
                        }
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_d00);
                        poVar5 = ::std::operator<<((ostream *)local_d00,"[error]");
                        poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar5 = ::std::operator<<(poVar5,"[Crate]");
                        poVar5 = ::std::operator<<(poVar5,":");
                        poVar5 = ::std::operator<<(poVar5,"ReadFieldSets");
                        poVar5 = ::std::operator<<(poVar5,"():");
                        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x16db);
                        ::std::operator<<(poVar5," ");
                        poVar5 = ::std::operator<<((ostream *)local_d00,
                                                                                                      
                                                  "Failed to read fieldsets size at `FIELDSETS` section."
                                                  );
                        ::std::operator<<(poVar5,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_d20);
                        ::std::__cxx11::string::~string((string *)&local_d20);
                        this_local._7_1_ = 0;
                        tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_d00);
                      }
                      std::vector<char,_std::allocator<char>_>::~vector
                                ((vector<char,_std::allocator<char>_> *)&fsets_size);
                    }
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &workBufferSize);
                  }
                  std::vector<char,_std::allocator<char>_>::~vector
                            ((vector<char,_std::allocator<char>_> *)local_810);
                }
              }
            }
          }
          else {
            ::std::__cxx11::string::operator+=
                      ((string *)&this->_err,
                       "Failed to read # of fieldsets at `FIELDSETS` section.\n");
            this_local._7_1_ = 0;
          }
        }
        else {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to move to `FIELDSETS` section.\n");
          this_local._7_1_ = 0;
        }
      }
      goto LAB_0024bacf;
    }
  }
  ::std::__cxx11::string::operator+=
            ((string *)&this->_err,"Invalid index for `FIELDSETS` section.\n");
  this_local._7_1_ = 0;
LAB_0024bacf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadFieldSets() {
  if ((_fieldsets_index < 0) ||
      (_fieldsets_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDSETS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fieldsets_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDSETS` section.\n";
    return false;
  }

  uint64_t num_fieldsets;
  if (!_sr->read8(&num_fieldsets)) {
    _err += "Failed to read # of fieldsets at `FIELDSETS` section.\n";
    return false;
  }

  if (num_fieldsets == 0) {
    // At least 1 FieldIndex(separator(~0)) must exist.
    PUSH_ERROR("`FIELDSETS` is empty.");
    return false;
  }

  if (num_fieldsets > _config.maxNumFieldSets) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many FieldSets {}. maxNumFieldSets is set to {}", num_fieldsets, _config.maxNumFieldSets));
  }

  CHECK_MEMORY_USAGE(size_t(num_fieldsets) * sizeof(uint32_t));

  _fieldset_indices.resize(static_cast<size_t>(num_fieldsets));

  // Create temporary space for decompressing.
  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(sizeof(uint32_t) * size_t(num_fieldsets));
  std::vector<uint32_t> tmp;
  tmp.resize(static_cast<size_t>(num_fieldsets));

  size_t workBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  uint64_t fsets_size;
  if (!_sr->read8(&fsets_size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets size at `FIELDSETS` section.");
  }

  DCOUT("num_fieldsets = " << num_fieldsets << ", fsets_size = " << fsets_size
                           << ", comp_buffer.size = " << comp_buffer.size());

  if (fsets_size > comp_buffer.size()) {
    // Maybe corrupted?
    fsets_size = comp_buffer.size();
  }

  if (fsets_size > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "FieldSets compressed data exceeds USDC data.");
  }

  if (fsets_size !=
      _sr->read(size_t(fsets_size), size_t(fsets_size),
                reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets data at `FIELDSETS` section.");
  }

  std::string err;
  Usd_IntegerCompression::DecompressFromBuffer(
      comp_buffer.data(), size_t(fsets_size), tmp.data(), size_t(num_fieldsets),
      &err, working_space.data());

  if (!err.empty()) {
    _err += err;
    return false;
  }

  for (size_t i = 0; i != num_fieldsets; ++i) {
    DCOUT("fieldset_index[" << i << "] = " << tmp[i]);
    _fieldset_indices[i].value = tmp[i];
  }

  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(compBufferSize);

  return true;
}